

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_sllq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  l_00 = gen_new_label_ppc64(s);
  ret = tcg_temp_local_new_i64(s);
  ret_00 = tcg_temp_local_new_i64(s);
  ret_01 = tcg_temp_local_new_i64(s);
  tcg_gen_andi_i64_ppc64
            (s,ret_01,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x1f);
  tcg_gen_movi_i64_ppc64(s,ret_00,0xffffffff);
  tcg_gen_shl_i64_ppc64(s,ret_00,ret_00,ret_01);
  tcg_gen_andi_i64_ppc64(s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x20)
  ;
  tcg_gen_brcondi_i64_ppc64(s,TCG_COND_EQ,ret,0,l);
  gen_load_spr(s,ret,0);
  tcg_gen_and_i64_ppc64(s,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],ret,ret_00);
  tcg_gen_br(s,l_00);
  gen_set_label(s,l);
  tcg_gen_shl_i64_ppc64
            (s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret_01);
  gen_load_spr(s,ret_01,0);
  tcg_gen_andc_i64_ppc64(s,ret_00,ret_01,ret_00);
  tcg_gen_or_i64_ppc64(s,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],ret,ret_00);
  gen_set_label(s,l_00);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_01 + (long)s));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)));
  return;
}

Assistant:

static void gen_sllq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);
    TCGv t1 = tcg_temp_local_new(tcg_ctx);
    TCGv t2 = tcg_temp_local_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t2, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_movi_tl(tcg_ctx, t1, 0xFFFFFFFF);
    tcg_gen_shl_tl(tcg_ctx, t1, t1, t2);
    tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 0x20);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t0, 0, l1);
    gen_load_spr(tcg_ctx, t0, SPR_MQ);
    tcg_gen_and_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_shl_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], t2);
    gen_load_spr(tcg_ctx, t2, SPR_MQ);
    tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
    tcg_gen_or_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    gen_set_label(tcg_ctx, l2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}